

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

LOs __thiscall Omega_h::get_degrees(Omega_h *this,LOs *offsets,string *name)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  Alloc *pAVar7;
  Alloc *this_00;
  LOs LVar8;
  Write<int> degrees;
  type f;
  Write<int> local_68;
  Write<int> local_50;
  Alloc *local_40;
  void *local_38;
  Alloc *local_30;
  void *local_28;
  
  pAVar7 = (offsets->write_).shared_alloc_.alloc;
  if (((ulong)pAVar7 & 1) == 0) {
    sVar5 = pAVar7->size;
  }
  else {
    sVar5 = (ulong)pAVar7 >> 3;
  }
  Write<int>::Write(&local_68,(int)(sVar5 >> 2) + -1,name);
  local_40 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38 = local_68.shared_alloc_.direct_ptr;
  local_30 = (offsets->write_).shared_alloc_.alloc;
  if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_30 = (Alloc *)(local_30->size * 8 + 1);
    }
    else {
      local_30->use_count = local_30->use_count + 1;
    }
  }
  local_28 = (offsets->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_68.shared_alloc_.alloc & 1) == 0) {
    uVar3 = (local_68.shared_alloc_.alloc)->size;
  }
  else {
    uVar3 = (ulong)local_68.shared_alloc_.alloc >> 3;
  }
  pAVar7 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar7 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  this_00 = local_30;
  if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      this_00 = (Alloc *)(local_30->size * 8 + 1);
    }
    else {
      local_30->use_count = local_30->use_count + 1;
    }
  }
  iVar2 = (int)(uVar3 >> 2);
  if (0 < iVar2) {
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      pAVar7->use_count = pAVar7->use_count + -1;
      pAVar7 = (Alloc *)(pAVar7->size * 8 + 1);
    }
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      this_00->use_count = this_00->use_count + -1;
      this_00 = (Alloc *)(this_00->size * 8 + 1);
    }
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      *(int *)((long)local_68.shared_alloc_.direct_ptr + lVar6 * 4) =
           *(int *)((long)local_28 + lVar6 * 4 + 4) - *(int *)((long)local_28 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (iVar2 != (int)lVar6);
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &pAVar7->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  local_50.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  local_50.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
       local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
    local_50.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_50);
  pAVar7 = local_50.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar7 = local_30;
  if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
    piVar1 = &local_30->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  pAVar7 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar7 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  LVar8.write_.shared_alloc_.direct_ptr = pvVar4;
  LVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar8.write_.shared_alloc_;
}

Assistant:

LOs get_degrees(LOs offsets, std::string const& name) {
  Write<LO> degrees(offsets.size() - 1, name);
  auto f = OMEGA_H_LAMBDA(LO i) { degrees[i] = offsets[i + 1] - offsets[i]; };
  parallel_for(degrees.size(), f, "get_degrees");
  return degrees;
}